

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_ea.h
# Opt level: O3

void print_ea(size_t idx,size_t offset,FILE_FULL_EA_INFORMATION *e)

{
  byte bVar1;
  ushort uVar2;
  ulong uVar3;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  printf("FILE_FULL_EA_INFORMATION[%zi] @ = 0x%p, buffer offset %zi\n",idx,e,offset);
  printf("FILE_FULL_EA_INFORMATION[%zi].NextEntryOffset = %u\n",idx,(ulong)e->NextEntryOffset);
  printf("FILE_FULL_EA_INFORMATION[%zi].Flags = %i\n",idx,(ulong)e->Flags);
  bVar1 = e->EaNameLength;
  if (bVar1 == 0) {
    local_48 = &local_38;
    local_40 = 0;
    local_38 = 0;
  }
  else {
    local_48 = &local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,e->EaName,e->EaName + (uint)bVar1);
  }
  printf("FILE_FULL_EA_INFORMATION[%zi].EaNameLength = %i \"%s\"\n",idx,(ulong)(uint)bVar1,local_48)
  ;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  printf("FILE_FULL_EA_INFORMATION[%zi].EaValueLength = %hu\n",idx,(ulong)e->EaValueLength);
  uVar2 = e->EaValueLength;
  if ((ulong)uVar2 != 0) {
    bVar1 = e->EaNameLength;
    uVar3 = 0;
    do {
      printf("%x",(ulong)(uint)(int)e->EaName[uVar3 + bVar1]);
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
    putchar(10);
  }
  return;
}

Assistant:

inline void print_ea(size_t idx, 
                     size_t offset,
                     FILE_FULL_EA_INFORMATION const &e) {
    std::printf("FILE_FULL_EA_INFORMATION[%zi] @ = 0x%p, buffer offset %zi\n",
           idx,
           iffl::cast_to_void_ptr(&e),
           offset);
    std::printf("FILE_FULL_EA_INFORMATION[%zi].NextEntryOffset = %u\n",
           idx,
           e.NextEntryOffset);
    std::printf("FILE_FULL_EA_INFORMATION[%zi].Flags = %i\n",
           idx,
           static_cast<int>(e.Flags));
    std::printf("FILE_FULL_EA_INFORMATION[%zi].EaNameLength = %i \"%s\"\n",
           idx,
           static_cast<int>(e.EaNameLength),
           (e.EaNameLength ? std::string{ e.EaName, e.EaName + e.EaNameLength }
                           : std::string{}).c_str());
    std::printf("FILE_FULL_EA_INFORMATION[%zi].EaValueLength = %hu\n",
           idx,
           e.EaValueLength);
    if (e.EaValueLength) {
        char const * data_first = e.EaName + e.EaNameLength;
        char const * const data_end = e.EaName + e.EaNameLength + e.EaValueLength;
        for (; data_first != data_end; ++data_first) {
            std::printf("%x", static_cast<int>(*data_first));
        }
        std::printf("\n");
    }
}